

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall c4::yml::Parser::LineContents::current_col(LineContents *this,csubstr s)

{
  Location loc;
  Location loc_00;
  bool bVar1;
  error_flags eVar2;
  long in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  size_t col;
  size_t in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  Location *in_stack_ffffffffffffff30;
  char (*in_stack_ffffffffffffff70) [32];
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  ulong uVar3;
  undefined8 in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  size_t sStack_58;
  char *local_50;
  Location *pLStack_48;
  
  if (in_RSI < *in_RDI) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20
                       ,in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff18 = in_stack_ffffffffffffffa0;
    loc.super_LineCol.line = in_stack_ffffffffffffff88;
    loc.super_LineCol.offset = in_stack_ffffffffffffff80;
    loc.super_LineCol.col = in_stack_ffffffffffffff90;
    loc.name.str = (char *)in_stack_ffffffffffffff98;
    loc.name.len = in_stack_ffffffffffffff18;
    in_stack_ffffffffffffffa0 = in_stack_ffffffffffffff18;
    error<32ul>(in_stack_ffffffffffffff70,loc);
    in_stack_ffffffffffffff20 = sStack_58;
    in_stack_ffffffffffffff28 = local_50;
    in_stack_ffffffffffffff30 = pLStack_48;
  }
  if (in_RDI[1] == 0) {
    bVar1 = false;
    if ((in_RDX == 0) && (bVar1 = false, in_RSI == *in_RDI)) {
      bVar1 = *in_RDI != 0;
    }
  }
  else {
    bVar1 = false;
    if (*in_RDI <= in_RSI) {
      bVar1 = in_RSI + in_RDX <= *in_RDI + in_RDI[1];
    }
  }
  if (!bVar1) {
    uVar3 = in_RSI;
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20
                       ,in_stack_ffffffffffffff18);
    loc_00.super_LineCol.line = in_stack_ffffffffffffff88;
    loc_00.super_LineCol.offset = in_stack_ffffffffffffff80;
    loc_00.super_LineCol.col = uVar3;
    loc_00.name.str = (char *)in_RDX;
    loc_00.name.len = in_stack_ffffffffffffffa0;
    error<31ul>((char (*) [31])in_stack_ffffffffffffff70,loc_00);
  }
  return in_RSI - *in_RDI;
}

Assistant:

size_t current_col(csubstr s) const
        {
            RYML_ASSERT(s.str >= full.str);
            RYML_ASSERT(full.is_super(s));
            size_t col = static_cast<size_t>(s.str - full.str);
            return col;
        }